

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O0

void __thiscall amrex::AmrMesh::ClearDistributionMap(AmrMesh *this,int lev)

{
  DistributionMapping *in_RDI;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  *in_stack_ffffffffffffffe0;
  
  DistributionMapping::DistributionMapping((DistributionMapping *)0x10d5b00);
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
            (in_stack_ffffffffffffffe0,(size_type)in_RDI);
  DistributionMapping::operator=((DistributionMapping *)in_stack_ffffffffffffffe0,in_RDI);
  DistributionMapping::~DistributionMapping((DistributionMapping *)0x10d5b2e);
  return;
}

Assistant:

void
AmrMesh::ClearDistributionMap (int lev) noexcept
{
    dmap[lev] = DistributionMapping();
}